

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O1

uint Jupiter_strtoui_nospace_s(char *str,size_t length,int base)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  byte *pbVar5;
  size_t sVar6;
  
  uVar2 = 0;
  if (length == 0) {
    return 0;
  }
  if (*str == '+') {
    length = length - 1;
    if (length == 0) {
      return 0;
    }
    str = str + 1;
  }
  else if (*str == '-') {
    uVar2 = Jupiter_strtoi_nospace(str,base);
    return uVar2;
  }
  sVar3 = length;
  pbVar5 = (byte *)str;
  if (base == 0x10) {
    base = 0x10;
    if (*str == 0x30) {
      if (length - 1 == 0) {
        return 0;
      }
      if ((((byte *)str)[1] | 0x20) == 0x78) {
        sVar3 = length - 2;
        if (sVar3 == 0) {
          return 0;
        }
        pbVar5 = (byte *)str + 2;
      }
      else {
        sVar3 = length - 1;
        pbVar5 = (byte *)str + 1;
        base = 0x10;
      }
    }
    goto LAB_001282d2;
  }
  if ((base != 0) || (base = 10, *str != 0x30)) goto LAB_001282d2;
  sVar3 = length - 1;
  if (sVar3 == 0) {
    return 0;
  }
  pbVar5 = (byte *)str + 1;
  bVar1 = ((byte *)str)[1];
  base = 8;
  if (bVar1 < 0x62) {
    if (bVar1 == 0x42) {
LAB_001282bd:
      if (length - 2 == 0) {
        return 0;
      }
      base = 2;
      sVar3 = length - 2;
      pbVar5 = (byte *)str + 2;
      goto LAB_001282d2;
    }
    if (bVar1 != 0x58) goto LAB_001282d2;
  }
  else {
    if (bVar1 == 0x62) goto LAB_001282bd;
    if (bVar1 != 0x78) goto LAB_001282d2;
  }
  if (length - 2 == 0) {
    return 0;
  }
  base = 0x10;
  sVar3 = length - 2;
  pbVar5 = (byte *)str + 2;
LAB_001282d2:
  uVar4 = (uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                [*pbVar5];
  if ((int)(uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                 [*pbVar5] < base) {
    uVar2 = 0;
    sVar6 = 1;
    do {
      uVar2 = uVar2 * base + uVar4;
      if (sVar3 == sVar6) {
        return uVar2;
      }
      uVar4 = (uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                    [pbVar5[sVar6]];
      sVar6 = sVar6 + 1;
    } while ((int)uVar4 < base);
  }
  return uVar2;
}

Assistant:

unsigned int Jupiter_strtoui_nospace_s(const char *str, size_t length, int base)
{
	unsigned int total = 0;
	int tval;

	if (length == 0)
		return total;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
	{
		if (--length == 0)
			return total;
		++str;
	}

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			if (--length == 0)
				return total;

			++str;
			switch (*str)
			{
			case 'X':
			case 'x':
				if (--length == 0)
					return total;

				++str;
				base = 16;
				break;

			case 'B':
			case 'b':
				if (--length == 0)
					return total;

				++str;
				base = 2;
				break;

			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			if (--length == 0)
				return total;
			++str;
			if (*str == 'x' || *str == 'X')
			{
				if (--length == 0)
					return total;
				++str;
			}
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		if (--length == 0)
			return total;
		++str;
	}

	return total;
}